

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task26.cpp
# Opt level: O2

void resize(IntArray *arr,int newSize)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = 0xffffffffffffffff;
  if (-1 < newSize) {
    uVar6 = (ulong)(uint)newSize << 2;
  }
  piVar3 = (int *)operator_new__(uVar6);
  uVar2 = arr->size;
  uVar5 = newSize;
  if ((int)uVar2 < newSize) {
    uVar5 = uVar2;
  }
  uVar7 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  piVar1 = arr->data;
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    piVar3[uVar7] = piVar1[uVar7];
  }
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
    uVar2 = arr->size;
  }
  arr->data = piVar3;
  if ((int)uVar2 < newSize) {
    for (lVar4 = (long)(int)uVar2; lVar4 < newSize; lVar4 = lVar4 + 1) {
      piVar3[lVar4] = 0;
    }
  }
  arr->size = newSize;
  return;
}

Assistant:

void resize(IntArray* arr, int newSize){
    int* new_arr = new int [newSize];
    for (int i = 0; i < min(newSize, arr->size); i++) new_arr[i] = arr->data[i];
    delete[]arr->data;
    arr->data = new_arr;
    if (newSize > arr->size) for (int i = arr->size; i < newSize; i++) arr->data[i] = 0;
    arr->size = newSize;
}